

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

int re2::Fanout(Prog *prog,vector<int,_std::allocator<int>_> *histogram)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  SparseArray<int> fanout;
  int data [32];
  
  SparseArray<int>::SparseArray(&fanout,prog->size_);
  Prog::Fanout(prog,&fanout);
  data[0x1c] = 0;
  data[0x1d] = 0;
  data[0x1e] = 0;
  data[0x1f] = 0;
  data[0x18] = 0;
  data[0x19] = 0;
  data[0x1a] = 0;
  data[0x1b] = 0;
  data[0x14] = 0;
  data[0x15] = 0;
  data[0x16] = 0;
  data[0x17] = 0;
  data[0x10] = 0;
  data[0x11] = 0;
  data[0x12] = 0;
  data[0x13] = 0;
  data[0xc] = 0;
  data[0xd] = 0;
  data[0xe] = 0;
  data[0xf] = 0;
  data[8] = 0;
  data[9] = 0;
  data[10] = 0;
  data[0xb] = 0;
  data[4] = 0;
  data[5] = 0;
  data[6] = 0;
  data[7] = 0;
  data[0] = 0;
  data[1] = 0;
  data[2] = 0;
  data[3] = 0;
  uVar2 = 0;
  for (lVar1 = (long)fanout.size_ << 3; lVar1 != 0; lVar1 = lVar1 + -8) {
    if ((fanout.dense_.ptr_._M_t.
         super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
         ._M_t.
         super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
         .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl)->value_ !=
        0) {
      uVar3 = 0x20;
      uVar4 = (fanout.dense_.ptr_._M_t.
               super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
               .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl)->
              value_ - 1;
      if (uVar4 != 0) {
        uVar3 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar3 = uVar3 ^ 0x1f;
      }
      data[0x20 - uVar3] = data[0x20 - uVar3] + 1;
      if ((int)uVar2 <= (int)(0x21 - uVar3)) {
        uVar2 = 0x21 - uVar3;
      }
    }
    fanout.dense_.ptr_._M_t.
    super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
    .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl =
         fanout.dense_.ptr_._M_t.
         super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
         ._M_t.
         super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
         .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl + 1;
  }
  if (histogram != (vector<int,_std::allocator<int>_> *)0x0) {
    std::vector<int,std::allocator<int>>::_M_assign_aux<int*>
              ((vector<int,std::allocator<int>> *)histogram,data,data + uVar2);
  }
  SparseArray<int>::~SparseArray(&fanout);
  return uVar2 - 1;
}

Assistant:

static int Fanout(Prog* prog, std::vector<int>* histogram) {
  SparseArray<int> fanout(prog->size());
  prog->Fanout(&fanout);
  int data[32] = {};
  int size = 0;
  for (SparseArray<int>::iterator i = fanout.begin(); i != fanout.end(); ++i) {
    if (i->value() == 0)
      continue;
    uint32_t value = i->value();
    int bucket = FindMSBSet(value);
    bucket += value & (value-1) ? 1 : 0;
    ++data[bucket];
    size = std::max(size, bucket+1);
  }
  if (histogram != NULL)
    histogram->assign(data, data+size);
  return size-1;
}